

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::SetShadingRate
          (DeviceContextVkImpl *this,SHADING_RATE BaseRate,SHADING_RATE_COMBINER PrimitiveCombiner,
          SHADING_RATE_COMBINER TextureCombiner)

{
  element_type *peVar1;
  undefined7 in_register_00000009;
  char (*Args_1) [32];
  string msg;
  VkFragmentShadingRateCombinerOpKHR CombinerOps [2];
  string local_50;
  VkFragmentShadingRateCombinerOpKHR local_30;
  VkFragmentShadingRateCombinerOpKHR local_2c;
  VkExtent2D local_28;
  
  Args_1 = (char (*) [32])CONCAT71(in_register_00000009,TextureCombiner);
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetShadingRate
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,BaseRate,PrimitiveCombiner,
             TextureCombiner,0);
  peVar1 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
           m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate == 0) {
    if ((peVar1->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap == 0) {
      FormatString<char[50]>(&local_50,(char (*) [50])0x77202f);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xfc0);
    }
    else {
      if (BaseRate != SHADING_RATE_1X1) {
        FormatString<char[66]>
                  (&local_50,
                   (char (*) [66])
                   "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (PrimitiveCombiner != SHADING_RATE_COMBINER_PASSTHROUGH) {
        FormatString<char[92]>
                  (&local_50,
                   (char (*) [92])
                   "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH"
                  );
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"SetShadingRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xfbc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (TextureCombiner == SHADING_RATE_COMBINER_OVERRIDE) {
        return;
      }
      FormatString<char[87]>
                (&local_50,
                 (char (*) [87])
                 "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE"
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xfbd);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_30 = ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner);
    local_2c = ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner);
    EnsureVkCmdBuffer(this);
    local_28 = ShadingRateToVkFragmentSize(BaseRate);
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_50,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",Args_1);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetFragmentShadingRate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x315);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdSetFragmentShadingRateKHR)((this->m_CommandBuffer).m_VkCmdBuffer,&local_28,&local_30);
    (this->m_State).ShadingRateIsSet = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetShadingRate(SHADING_RATE BaseRate, SHADING_RATE_COMBINER PrimitiveCombiner, SHADING_RATE_COMBINER TextureCombiner)
{
    TDeviceContextBase::SetShadingRate(BaseRate, PrimitiveCombiner, TextureCombiner, 0);

    const auto& ExtFeatures = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
    if (ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
    {
        const VkFragmentShadingRateCombinerOpKHR CombinerOps[2] =
            {
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(PrimitiveCombiner),
                ShadingRateCombinerToVkFragmentShadingRateCombinerOp(TextureCombiner) //
            };

        EnsureVkCmdBuffer();
        m_CommandBuffer.SetFragmentShadingRate(ShadingRateToVkFragmentSize(BaseRate), CombinerOps);
        m_State.ShadingRateIsSet = true;
    }
    else if (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
    {
        // Ignored
        DEV_CHECK_ERR(BaseRate == SHADING_RATE_1X1, "IDeviceContext::SetShadingRate: BaseRate must be SHADING_RATE_1X1");
        DEV_CHECK_ERR(PrimitiveCombiner == SHADING_RATE_COMBINER_PASSTHROUGH, "IDeviceContext::SetShadingRate: PrimitiveCombiner must be SHADING_RATE_COMBINER_PASSTHROUGH");
        DEV_CHECK_ERR(TextureCombiner == SHADING_RATE_COMBINER_OVERRIDE, "IDeviceContext::SetShadingRate: TextureCombiner must be SHADING_RATE_COMBINER_OVERRIDE");
    }
    else
        UNEXPECTED("VariableRateShading device feature is not enabled");
}